

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O1

bool absl::debugging_internal::ParseCVQualifiers(State *state)

{
  ParseState *pPVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  undefined4 uVar6;
  bool bVar7;
  bool bVar8;
  bool bVar9;
  uint uVar10;
  
  iVar2 = state->recursion_depth;
  iVar3 = state->steps;
  state->recursion_depth = iVar2 + 1;
  state->steps = iVar3 + 1;
  uVar10 = 0;
  if (iVar3 < 0x20000 && iVar2 < 0x100) {
    state->recursion_depth = iVar2 + 2;
    state->steps = iVar3 + 2;
    if (iVar3 < 0x1ffff && iVar2 < 0xff) {
      pPVar1 = &state->parse_state;
      uVar10 = 0;
      while( true ) {
        iVar2 = pPVar1->mangled_idx;
        iVar3 = pPVar1->out_cur_idx;
        iVar5 = (state->parse_state).prev_name_idx;
        uVar6 = *(undefined4 *)&(state->parse_state).field_0xc;
        bVar7 = ParseOneCharToken(state,'U');
        if (!bVar7) break;
        uVar4 = *(uint *)&(state->parse_state).field_0xc;
        *(uint *)&(state->parse_state).field_0xc = uVar4 & 0x7fffffff;
        bVar7 = ParseSourceName(state);
        if (bVar7) {
          ParseTemplateArgs(state);
          *(uint *)&(state->parse_state).field_0xc =
               *(uint *)&(state->parse_state).field_0xc & 0x7fffffff | uVar4 & 0x80000000;
        }
        else {
          pPVar1->mangled_idx = iVar2;
          pPVar1->out_cur_idx = iVar3;
          (state->parse_state).prev_name_idx = iVar5;
          *(undefined4 *)&(state->parse_state).field_0xc = uVar6;
        }
        iVar2 = state->recursion_depth;
        state->recursion_depth = iVar2 + -1;
        if (!bVar7) goto LAB_00279389;
        uVar10 = uVar10 + 1;
        state->recursion_depth = iVar2;
        iVar3 = state->steps;
        state->steps = iVar3 + 1;
        if ((0x100 < iVar2) || (0x1ffff < iVar3)) break;
      }
    }
    state->recursion_depth = state->recursion_depth + -1;
LAB_00279389:
    bVar7 = ParseOneCharToken(state,'r');
    bVar8 = ParseOneCharToken(state,'V');
    bVar9 = ParseOneCharToken(state,'K');
    uVar10 = (uint)(bVar9 || (uint)bVar8 + bVar7 + uVar10 != 0);
  }
  state->recursion_depth = state->recursion_depth + -1;
  return SUB41(uVar10,0);
}

Assistant:

static bool ParseCVQualifiers(State *state) {
  ComplexityGuard guard(state);
  if (guard.IsTooComplex()) return false;
  int num_cv_qualifiers = 0;
  while (ParseExtendedQualifier(state)) ++num_cv_qualifiers;
  num_cv_qualifiers += ParseOneCharToken(state, 'r');
  num_cv_qualifiers += ParseOneCharToken(state, 'V');
  num_cv_qualifiers += ParseOneCharToken(state, 'K');
  return num_cv_qualifiers > 0;
}